

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_state.cpp
# Opt level: O3

void __thiscall cppurses::detail::Screen_state::Optimize::reset(Optimize *this)

{
  _Bit_type *p_Var1;
  
  this->just_enabled = false;
  this->moved = false;
  this->resized = false;
  this->child_event = false;
  p_Var1 = (this->resize_mask).bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  (this->move_mask).bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (this->move_mask).bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  *(uint *)((long)&(this->move_mask).bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  (this->resize_mask).bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var1;
  *(uint *)((long)&(this->resize_mask).bits_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = 0;
  return;
}

Assistant:

void Screen_state::Optimize::reset() {
    this->just_enabled = false;
    this->moved = false;
    this->resized = false;
    this->child_event = false;
    this->move_mask.clear();
    this->resize_mask.clear();
}